

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebugger.h
# Opt level: O0

int __thiscall
DebuggerTestHelper::bind(DebuggerTestHelper *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int extraout_EAX;
  pointer pSVar1;
  function<void_()> local_c0;
  sockaddr local_a0;
  shared_ptr<dap::Reader> local_90;
  function<void_()> local_80;
  sockaddr local_60;
  shared_ptr<dap::Reader> local_50 [2];
  undefined1 local_30 [8];
  shared_ptr<dap::ReaderWriter> server2client;
  shared_ptr<dap::ReaderWriter> client2server;
  DebuggerTestHelper *this_local;
  
  dap::pipe((int *)&server2client.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  dap::pipe((int *)local_30);
  pSVar1 = std::unique_ptr<dap::Session,_std::default_delete<dap::Session>_>::operator->
                     (&this->Client);
  std::shared_ptr<dap::Reader>::shared_ptr<dap::ReaderWriter,void>
            (local_50,(shared_ptr<dap::ReaderWriter> *)local_30);
  std::shared_ptr<dap::Writer>::shared_ptr<dap::ReaderWriter,void>
            ((shared_ptr<dap::Writer> *)&local_60,
             (shared_ptr<dap::ReaderWriter> *)
             &server2client.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::function<void_()>::function(&local_80);
  dap::Session::bind(pSVar1,(int)local_50,&local_60,(socklen_t)&local_80);
  std::function<void_()>::~function(&local_80);
  std::shared_ptr<dap::Writer>::~shared_ptr((shared_ptr<dap::Writer> *)&local_60);
  std::shared_ptr<dap::Reader>::~shared_ptr(local_50);
  pSVar1 = std::unique_ptr<dap::Session,_std::default_delete<dap::Session>_>::operator->
                     (&this->Debugger);
  std::shared_ptr<dap::Reader>::shared_ptr<dap::ReaderWriter,void>
            (&local_90,
             (shared_ptr<dap::ReaderWriter> *)
             &server2client.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<dap::Writer>::shared_ptr<dap::ReaderWriter,void>
            ((shared_ptr<dap::Writer> *)&local_a0,(shared_ptr<dap::ReaderWriter> *)local_30);
  std::function<void_()>::function(&local_c0);
  dap::Session::bind(pSVar1,(int)&local_90,&local_a0,(socklen_t)&local_c0);
  std::function<void_()>::~function(&local_c0);
  std::shared_ptr<dap::Writer>::~shared_ptr((shared_ptr<dap::Writer> *)&local_a0);
  std::shared_ptr<dap::Reader>::~shared_ptr(&local_90);
  std::shared_ptr<dap::ReaderWriter>::~shared_ptr((shared_ptr<dap::ReaderWriter> *)local_30);
  std::shared_ptr<dap::ReaderWriter>::~shared_ptr
            ((shared_ptr<dap::ReaderWriter> *)
             &server2client.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return extraout_EAX;
}

Assistant:

void bind()
  {
    auto client2server = dap::pipe();
    auto server2client = dap::pipe();
    Client->bind(server2client, client2server);
    Debugger->bind(client2server, server2client);
  }